

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict pointer(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  pos_t p;
  uint uVar2;
  node_t_conflict pnVar3;
  char *expected_name;
  node *n;
  int no_err_p_00;
  parse_ctx_t parse_ctx;
  
  ppVar1 = c2m_ctx->parse_ctx;
  if (*(short *)ppVar1->curr_token == 0x2a) {
    p = ppVar1->curr_token->pos;
    read_token(c2m_ctx);
    uVar2 = *(ushort *)ppVar1->curr_token - 0x114;
    if ((uVar2 < 0x28) && ((0x8004000401U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
      pnVar3 = type_qual_list(c2m_ctx,no_err_p);
      if (pnVar3 == &err_struct) {
        return &err_struct;
      }
    }
    else {
      pnVar3 = new_node(c2m_ctx,N_LIST);
    }
    no_err_p_00 = 0x76;
    pnVar3 = new_pos_node1(c2m_ctx,N_POINTER,p,pnVar3);
    if (*(short *)ppVar1->curr_token == 0x2a) {
      n = pointer(c2m_ctx,no_err_p_00);
      if (n == &err_struct) {
        return &err_struct;
      }
    }
    else {
      n = new_node(c2m_ctx,N_LIST);
    }
    op_append(c2m_ctx,n,pnVar3);
  }
  else {
    n = &err_struct;
    if (ppVar1->record_level == 0) {
      expected_name = get_token_name(c2m_ctx,0x2a);
      syntax_error(c2m_ctx,expected_name);
    }
  }
  return n;
}

Assistant:

D (pointer) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t op, r;
  pos_t pos;

  PTP ('*', pos);
  if (C (T_CONST) || C (T_RESTRICT) || C (T_VOLATILE) || C (T_ATOMIC)) {
    P (type_qual_list);
  } else {
    r = new_node (c2m_ctx, N_LIST);
  }
  op = new_pos_node1 (c2m_ctx, N_POINTER, pos, r);
  if (C ('*')) {
    P (pointer);
  } else {
    r = new_node (c2m_ctx, N_LIST);
  }
  op_append (c2m_ctx, r, op);
  return r;
}